

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluationFile.cxx
# Opt level: O0

void __thiscall
cmGeneratorExpressionEvaluationFile::cmGeneratorExpressionEvaluationFile
          (cmGeneratorExpressionEvaluationFile *this,string *input,
          auto_ptr<cmCompiledGeneratorExpression> *outputFileExpr,
          auto_ptr<cmCompiledGeneratorExpression> *condition,bool inputIsContent)

{
  bool inputIsContent_local;
  auto_ptr<cmCompiledGeneratorExpression> *condition_local;
  auto_ptr<cmCompiledGeneratorExpression> *outputFileExpr_local;
  string *input_local;
  cmGeneratorExpressionEvaluationFile *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)input);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr(&this->OutputFileExpr,outputFileExpr);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr(&this->Condition,condition);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Files);
  this->InputIsContent = inputIsContent;
  return;
}

Assistant:

cmGeneratorExpressionEvaluationFile::cmGeneratorExpressionEvaluationFile(
        const std::string &input,
        cmsys::auto_ptr<cmCompiledGeneratorExpression> outputFileExpr,
        cmsys::auto_ptr<cmCompiledGeneratorExpression> condition,
        bool inputIsContent)
  : Input(input),
    OutputFileExpr(outputFileExpr),
    Condition(condition),
    InputIsContent(inputIsContent)
{
}